

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::gauss_newton
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  int i;
  long lVar1;
  int k;
  int iVar2;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_6,_1,_0,_6,_1> B;
  Matrix<double,_6,_4,_0,_6,_4> A;
  Matrix<double,_4,_1,_0,_4,_1> local_1a0;
  Matrix<double,_6,_1,_0,_6,_1> local_170;
  Matrix<double,_6,_4,_0,_6,_4> local_140;
  
  for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
    compute_A_and_b_gauss_newton(this,L_6x10,Rho,betas,&local_140,&local_170);
    qr_solve(this,&local_140,&local_170,&local_1a0);
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      betas[lVar1] = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[lVar1] + betas[lVar1];
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::gauss_newton(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double betas[4])
{
  const int iterations_number = 5;

  Eigen::Matrix<double,6,4> A;
  Eigen::Matrix<double,6,1> B;
  Eigen::Matrix<double,4,1> X;

  for(int k = 0; k < iterations_number; k++)
  {
    compute_A_and_b_gauss_newton(L_6x10,Rho,betas,A,B);
    qr_solve(A,B,X);

    for(int i = 0; i < 4; i++)
      betas[i] += X[i];
  }
}